

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *pZVar1;
  ZSTD_dictAttachPref_e ZVar2;
  void *pvVar3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ZSTD_strategy ZVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  ZSTD_compressionParameters cPar;
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params params_01;
  ZSTD_CCtx_params params_02;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  U32 UVar19;
  U32 end;
  U32 UVar20;
  uint uVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  ZSTD_matchState_t *srcMatchState;
  size_t sVar27;
  ZSTD_matchState_t *dstMatchState;
  byte bVar28;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 uVar29;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 uVar30;
  undefined4 in_stack_fffffffffffffea4;
  undefined1 auVar31 [12];
  undefined1 auVar32 [24];
  undefined1 in_stack_fffffffffffffea8 [112];
  undefined1 auVar33 [24];
  undefined4 local_dc;
  undefined4 uStack_d8;
  undefined1 local_c0 [8];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  
  bVar28 = 0;
  if (((((params->cParams).windowLog - 0x20 < 0xffffffea) ||
       ((params->cParams).chainLog - 0x1f < 0xffffffe7)) ||
      ((params->cParams).hashLog - 0x1f < 0xffffffe7)) ||
     ((((params->cParams).searchLog - 0x1f < 0xffffffe2 || (4 < (params->cParams).minMatch - 3)) ||
      ((0x20000 < (params->cParams).targetLength || (8 < (params->cParams).strategy - ZSTD_fast)))))
     ) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3637,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3638,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (cdict->dictContentSize == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff && (cdict->dictContentSize * 6 <= pledgedSrcSize)) &&
        (cdict->compressionLevel != 0)))))) ||
     (ZVar2 = params->attachDictPref, ZVar2 == ZSTD_dictForceLoad)) {
    puVar25 = (undefined8 *)&stack0xfffffffffffffe88;
    for (lVar24 = 0x12; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar25 = *(undefined8 *)params;
      params = (ZSTD_CCtx_params *)&(params->cParams).chainLog;
      puVar25 = puVar25 + 1;
    }
    params_01.cParams.chainLog = in_stack_fffffffffffffe90;
    params_01.format = (int)in_stack_fffffffffffffe88;
    params_01.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    params_01.cParams.hashLog = in_stack_fffffffffffffe94;
    params_01.cParams.searchLog = in_stack_fffffffffffffe98;
    params_01.cParams.minMatch = in_stack_fffffffffffffe9c;
    params_01.cParams.targetLength = in_stack_fffffffffffffea0;
    params_01.cParams.strategy = in_stack_fffffffffffffea4;
    auVar31 = in_stack_fffffffffffffea8._0_12_;
    auVar32 = in_stack_fffffffffffffea8._64_24_;
    auVar33 = in_stack_fffffffffffffea8._88_24_;
    params_01.fParams.contentSizeFlag = auVar31._0_4_;
    params_01.fParams.checksumFlag = auVar31._4_4_;
    params_01.fParams.noDictIDFlag = auVar31._8_4_;
    params_01.compressionLevel = in_stack_fffffffffffffea8._12_4_;
    params_01.forceWindow = in_stack_fffffffffffffea8._16_4_;
    params_01._52_4_ = in_stack_fffffffffffffea8._20_4_;
    params_01.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
    params_01.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
    params_01.attachDictPref = in_stack_fffffffffffffea8._36_4_;
    params_01.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
    params_01.nbWorkers = in_stack_fffffffffffffea8._44_4_;
    params_01.jobSize = in_stack_fffffffffffffea8._48_8_;
    params_01.overlapLog = in_stack_fffffffffffffea8._56_4_;
    params_01.rsyncable = in_stack_fffffffffffffea8._60_4_;
    params_01.ldmParams.enableLdm = auVar32._0_4_;
    params_01.ldmParams.hashLog = auVar32._4_4_;
    params_01.ldmParams.bucketSizeLog = auVar32._8_4_;
    params_01.ldmParams.minMatchLength = auVar32._12_4_;
    params_01.ldmParams.hashRateLog = auVar32._16_4_;
    params_01.ldmParams.windowLog = auVar32._20_4_;
    params_01.customMem.customAlloc = (ZSTD_allocFunction)auVar33._0_8_;
    params_01.customMem.customFree = (ZSTD_freeFunction)auVar33._8_8_;
    params_01.customMem.opaque = (void *)auVar33._16_8_;
    sVar22 = ZSTD_resetCCtx_internal(cctx,params_01,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
    if (sVar22 < 0xffffffffffffff89) {
      if (cdict == (ZSTD_CDict *)0x0) {
        uVar30 = SUB84(cctx->entropyWorkspace,0);
        uVar9 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      }
      else {
        dict = cdict->dictContent;
        dictSize = cdict->dictContentSize;
        uVar30 = SUB84(cctx->entropyWorkspace,0);
        uVar9 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      }
      sVar22 = ZSTD_compress_insertDictionary
                         ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,
                          &cctx->ldmState,&cctx->workspace,&cctx->appliedParams,dict,dictSize,
                          dictContentType,dtlm,(void *)CONCAT44(uVar9,uVar30));
      if (sVar22 < 0xffffffffffffff89) {
        if (sVar22 >> 0x20 == 0) {
          cctx->dictID = (U32)sVar22;
          return 0;
        }
        __assert_fail("dictID <= UINT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3650,
                      "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                     );
      }
      return sVar22;
    }
    return sVar22;
  }
  if (((ZVar2 == ZSTD_dictForceCopy) ||
      ((pledgedSrcSize != 0xffffffffffffffff && ZVar2 != ZSTD_dictForceAttach) &&
       attachDictSizeCutoffs[(cdict->matchState).cParams.strategy] < pledgedSrcSize)) ||
     (params->forceWindow != 0)) {
    memcpy(local_c0,params,0x90);
    if (local_c0._4_4_ == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30cc,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar5 = (cdict->matchState).cParams.chainLog;
    uVar6 = (cdict->matchState).cParams.hashLog;
    uVar7 = (cdict->matchState).cParams.searchLog;
    uVar8 = (cdict->matchState).cParams.minMatch;
    uStack_ac = uVar8;
    uStack_a8._0_4_ = (cdict->matchState).cParams.targetLength;
    uStack_a8._4_4_ = (cdict->matchState).cParams.strategy;
    uStack_b4 = uVar6;
    uStack_b0 = uVar7;
    stack0xffffffffffffff44 = CONCAT44(uVar5,local_c0._4_4_);
    puVar25 = (undefined8 *)local_c0;
    puVar26 = (undefined8 *)&stack0xfffffffffffffe88;
    for (lVar24 = 0x12; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar26 = *puVar25;
      puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
      puVar26 = puVar26 + (ulong)bVar28 * -2 + 1;
    }
    params_00.cParams.chainLog = in_stack_fffffffffffffe90;
    params_00.format = (int)in_stack_fffffffffffffe88;
    params_00.cParams.windowLog = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    params_00.cParams.hashLog = in_stack_fffffffffffffe94;
    params_00.cParams.searchLog = in_stack_fffffffffffffe98;
    params_00.cParams.minMatch = in_stack_fffffffffffffe9c;
    params_00.cParams.targetLength = in_stack_fffffffffffffea0;
    params_00.cParams.strategy = in_stack_fffffffffffffea4;
    auVar31 = in_stack_fffffffffffffea8._0_12_;
    auVar32 = in_stack_fffffffffffffea8._64_24_;
    auVar33 = in_stack_fffffffffffffea8._88_24_;
    params_00.fParams.contentSizeFlag = auVar31._0_4_;
    params_00.fParams.checksumFlag = auVar31._4_4_;
    params_00.fParams.noDictIDFlag = auVar31._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffea8._12_4_;
    params_00.forceWindow = in_stack_fffffffffffffea8._16_4_;
    params_00._52_4_ = in_stack_fffffffffffffea8._20_4_;
    params_00.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
    params_00.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
    params_00.attachDictPref = in_stack_fffffffffffffea8._36_4_;
    params_00.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
    params_00.nbWorkers = in_stack_fffffffffffffea8._44_4_;
    params_00.jobSize = in_stack_fffffffffffffea8._48_8_;
    params_00.overlapLog = in_stack_fffffffffffffea8._56_4_;
    params_00.rsyncable = in_stack_fffffffffffffea8._60_4_;
    params_00.ldmParams.enableLdm = auVar32._0_4_;
    params_00.ldmParams.hashLog = auVar32._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar32._8_4_;
    params_00.ldmParams.minMatchLength = auVar32._12_4_;
    params_00.ldmParams.hashRateLog = auVar32._16_4_;
    params_00.ldmParams.windowLog = auVar32._20_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar33._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar33._8_8_;
    params_00.customMem.opaque = (void *)auVar33._16_8_;
    sVar22 = ZSTD_resetCCtx_internal(cctx,params_00,pledgedSrcSize,ZSTDcrp_leaveDirty,zbuff);
    if (0xffffffffffffff88 < sVar22) {
      return sVar22;
    }
    if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
      __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30d2,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
      __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30d3,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
      __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30d4,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    pvVar3 = (cctx->workspace).objectEnd;
    pvVar4 = (cctx->workspace).tableValidEnd;
    if (pvVar4 < pvVar3) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d55,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if ((cctx->workspace).allocStart < pvVar4) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d56,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    (cctx->workspace).tableValidEnd = pvVar3;
    ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
    if ((cdict->matchState).cParams.strategy == ZSTD_fast) {
      sVar27 = 0;
    }
    else {
      sVar27 = 4L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
    }
    memcpy((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,
           4L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f));
    memcpy((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar27);
    if ((cdict->matchState).hashLog3 != 0) {
      __assert_fail("cdict->matchState.hashLog3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30e8,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    UVar20 = (cctx->blockState).matchState.hashLog3;
    sVar27 = 0;
    if (UVar20 != 0) {
      sVar27 = 4L << ((byte)UVar20 & 0x3f);
    }
    memset((cctx->blockState).matchState.hashTable3,0,sVar27);
    pvVar3 = (cctx->workspace).tableValidEnd;
    if (pvVar3 < (cctx->workspace).objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d5d,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if ((cctx->workspace).allocStart < pvVar3) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d5e,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    pvVar4 = (cctx->workspace).tableEnd;
    if (pvVar3 < pvVar4) {
      (cctx->workspace).tableValidEnd = pvVar4;
    }
    ZSTD_cwksp_assert_internal_consistency(&cctx->workspace);
    pBVar14 = (cdict->matchState).window.base;
    pBVar15 = (cdict->matchState).window.dictBase;
    UVar20 = (cdict->matchState).window.dictLimit;
    UVar19 = (cdict->matchState).window.lowLimit;
    (cctx->blockState).matchState.window.nextSrc = (cdict->matchState).window.nextSrc;
    (cctx->blockState).matchState.window.base = pBVar14;
    (cctx->blockState).matchState.window.dictBase = pBVar15;
    (cctx->blockState).matchState.window.dictLimit = UVar20;
    (cctx->blockState).matchState.window.lowLimit = UVar19;
    (cctx->blockState).matchState.nextToUpdate = (cdict->matchState).nextToUpdate;
    UVar20 = (cdict->matchState).loadedDictEnd;
  }
  else {
    memcpy(local_c0,params,0x90);
    uVar30 = local_c0._4_4_;
    if (local_c0._4_4_ == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3099,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    pZVar1 = &(cdict->matchState).cParams;
    uVar29._0_4_ = pZVar1->windowLog;
    uVar29._4_4_ = pZVar1->chainLog;
    uVar9 = (cdict->matchState).cParams.hashLog;
    uVar10 = (cdict->matchState).cParams.searchLog;
    uVar16 = pZVar1->windowLog;
    uVar17 = pZVar1->chainLog;
    uVar18 = pZVar1->hashLog;
    cPar.hashLog = uVar18;
    cPar.chainLog = uVar17;
    cPar.windowLog = uVar16;
    uVar11 = (cdict->matchState).cParams.minMatch;
    uVar12 = (cdict->matchState).cParams.targetLength;
    ZVar13 = (cdict->matchState).cParams.strategy;
    cPar.searchLog = uVar10;
    cPar.minMatch = uVar11;
    cPar.targetLength = uVar12;
    cPar.strategy = ZVar13;
    ZSTD_adjustCParams_internal((ZSTD_compressionParameters *)(local_c0 + 4),cPar,pledgedSrcSize,0);
    stack0xffffffffffffff44 = CONCAT44(uStack_b8,uVar30);
    puVar25 = (undefined8 *)local_c0;
    puVar26 = (undefined8 *)&stack0xfffffffffffffe88;
    for (lVar24 = 0x12; lVar24 != 0; lVar24 = lVar24 + -1) {
      *puVar26 = *puVar25;
      puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
      puVar26 = puVar26 + (ulong)bVar28 * -2 + 1;
    }
    params_02.cParams.chainLog = uVar9;
    params_02.format = (int)uVar29;
    params_02.cParams.windowLog = (int)((ulong)uVar29 >> 0x20);
    params_02.cParams.hashLog = uVar10;
    params_02.cParams.searchLog = uVar11;
    params_02.cParams.minMatch = uVar12;
    params_02.cParams.targetLength = ZVar13;
    params_02.cParams.strategy = in_stack_fffffffffffffea4;
    auVar31 = in_stack_fffffffffffffea8._0_12_;
    auVar32 = in_stack_fffffffffffffea8._64_24_;
    auVar33 = in_stack_fffffffffffffea8._88_24_;
    params_02.fParams.contentSizeFlag = auVar31._0_4_;
    params_02.fParams.checksumFlag = auVar31._4_4_;
    params_02.fParams.noDictIDFlag = auVar31._8_4_;
    params_02.compressionLevel = in_stack_fffffffffffffea8._12_4_;
    params_02.forceWindow = in_stack_fffffffffffffea8._16_4_;
    params_02._52_4_ = in_stack_fffffffffffffea8._20_4_;
    params_02.targetCBlockSize = in_stack_fffffffffffffea8._24_8_;
    params_02.srcSizeHint = in_stack_fffffffffffffea8._32_4_;
    params_02.attachDictPref = in_stack_fffffffffffffea8._36_4_;
    params_02.literalCompressionMode = in_stack_fffffffffffffea8._40_4_;
    params_02.nbWorkers = in_stack_fffffffffffffea8._44_4_;
    params_02.jobSize = in_stack_fffffffffffffea8._48_8_;
    params_02.overlapLog = in_stack_fffffffffffffea8._56_4_;
    params_02.rsyncable = in_stack_fffffffffffffea8._60_4_;
    params_02.ldmParams.enableLdm = auVar32._0_4_;
    params_02.ldmParams.hashLog = auVar32._4_4_;
    params_02.ldmParams.bucketSizeLog = auVar32._8_4_;
    params_02.ldmParams.minMatchLength = auVar32._12_4_;
    params_02.ldmParams.hashRateLog = auVar32._16_4_;
    params_02.ldmParams.windowLog = auVar32._20_4_;
    params_02.customMem.customAlloc = (ZSTD_allocFunction)auVar33._0_8_;
    params_02.customMem.customFree = (ZSTD_freeFunction)auVar33._8_8_;
    params_02.customMem.opaque = (void *)auVar33._16_8_;
    sVar22 = ZSTD_resetCCtx_internal(cctx,params_02,pledgedSrcSize,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar22) {
      return sVar22;
    }
    if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
      __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x30a1,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar23 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar21 = (uint)uVar23;
    if ((cdict->matchState).window.dictLimit == uVar21) goto LAB_0014cbd2;
    (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
    if ((cctx->blockState).matchState.window.dictLimit < uVar21) {
      (cctx->blockState).matchState.window.nextSrc =
           (cctx->blockState).matchState.window.base + (uVar23 & 0xffffffff);
      (cctx->blockState).matchState.window.lowLimit = uVar21;
      (cctx->blockState).matchState.window.dictLimit = uVar21;
    }
    UVar20 = (cctx->blockState).matchState.window.dictLimit;
  }
  (cctx->blockState).matchState.loadedDictEnd = UVar20;
LAB_0014cbd2:
  cctx->dictID = cdict->dictID;
  memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x11f0);
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, *params, pledgedSrcSize,
                                     ZSTDcrp_makeClean, zbuff) );
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, dictContentType, dtlm,
                        cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID);
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
    }
    return 0;
}